

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BinaryPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryPropertyExprSyntax,slang::syntax::SyntaxKind&,slang::syntax::PropertyExprSyntax&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,SyntaxKind *args,PropertyExprSyntax *args_1,Token *args_2,
          PropertyExprSyntax *args_3)

{
  SyntaxKind SVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  BinaryPropertyExprSyntax *pBVar7;
  
  pBVar7 = (BinaryPropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryPropertyExprSyntax *)this->endPtr < pBVar7 + 1) {
    pBVar7 = (BinaryPropertyExprSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pBVar7 + 1);
  }
  SVar1 = *args;
  TVar3 = args_2->kind;
  uVar4 = args_2->field_0x2;
  NVar5.raw = (args_2->numFlags).raw;
  uVar6 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pBVar7->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pBVar7->super_PropertyExprSyntax).super_SyntaxNode.kind = SVar1;
  (pBVar7->left).ptr = args_1;
  (pBVar7->op).kind = TVar3;
  (pBVar7->op).field_0x2 = uVar4;
  (pBVar7->op).numFlags = (NumericTokenFlags)NVar5.raw;
  (pBVar7->op).rawLen = uVar6;
  (pBVar7->op).info = pIVar2;
  (pBVar7->right).ptr = args_3;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pBVar7;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pBVar7;
  return pBVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }